

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall
kj::(anonymous_namespace)::expectResImpl<kj::Array<char16_t>,char16_t>
          (_anonymous_namespace_ *this,EncodingResult<kj::Array<char16_t>_> *result,
          ArrayPtr<const_char16_t> expected,bool errors)

{
  _anonymous_namespace_ *p_Var1;
  bool *pbVar2;
  bool *pbVar3;
  long lVar4;
  CappedArray<char,_5UL> CVar5;
  DebugExpression<const_bool_&> _kjCondition;
  unsigned_long i;
  CappedArray<char,_5UL> local_50;
  CappedArray<char,_5UL> local_40;
  
  pbVar2 = (bool *)expected.ptr;
  p_Var1 = this + 0x18;
  if ((int)expected.size_ == 0) {
    _kjCondition.value = (bool *)(CONCAT71(_kjCondition.value._1_7_,*p_Var1) ^ 1);
    if ((*p_Var1 != (_anonymous_namespace_)0x0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[35],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x31,ERROR,"\"failed: expected \" \"!result.hadErrors\", _kjCondition",
                 (char (*) [35])"failed: expected !result.hadErrors",
                 (DebugExpression<bool> *)&_kjCondition);
    }
  }
  else if ((*p_Var1 == (_anonymous_namespace_)0x0) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition.value = (bool *)p_Var1;
    kj::_::Debug::log<char_const(&)[34],kj::_::DebugExpression<bool_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x2f,ERROR,"\"failed: expected \" \"result.hadErrors\", _kjCondition",
               (char (*) [34])"failed: expected result.hadErrors",&_kjCondition);
  }
  _kjCondition.value = *(bool **)(this + 8);
  if ((_kjCondition.value != pbVar2) && (kj::_::Debug::minSeverity < 3)) {
    local_50.currentSize = (size_t)pbVar2;
    local_40.currentSize = (size_t)_kjCondition.value;
    kj::_::Debug::
    log<char_const(&)[50],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x34,ERROR,
               "\"failed: expected \" \"result.size() == expected.size()\", _kjCondition, result.size(), expected.size()"
               ,(char (*) [50])"failed: expected result.size() == expected.size()",
               (DebugComparison<unsigned_long,_unsigned_long> *)&_kjCondition,&local_40.currentSize,
               &local_50.currentSize);
    _kjCondition.value = *(bool **)(this + 8);
  }
  if (_kjCondition.value < pbVar2) {
    pbVar2 = _kjCondition.value;
  }
  lVar4 = 0;
  for (pbVar3 = (bool *)0x0; pbVar2 != pbVar3; pbVar3 = pbVar3 + 1) {
    _kjCondition.value = (bool *)(*(long *)this + lVar4);
    if ((*(short *)(*(long *)this + lVar4) !=
         *(short *)((long)&(result->super_Array<char16_t>).ptr + lVar4)) &&
       (kj::_::Debug::minSeverity < 3)) {
      i = (unsigned_long)pbVar3;
      CVar5 = anon_unknown_0::hex(*(char16_t *)_kjCondition.value);
      local_40.currentSize = CVar5.currentSize;
      local_40.content._0_4_ = CVar5.content._0_4_;
      local_40.content[4] = CVar5.content[4];
      CVar5 = anon_unknown_0::hex(*(char16_t *)((long)&(result->super_Array<char16_t>).ptr + i * 2))
      ;
      local_50.currentSize = CVar5.currentSize;
      local_50.content._0_4_ = CVar5.content._0_4_;
      local_50.content[4] = CVar5.content[4];
      kj::_::Debug::
      log<char_const(&)[42],kj::_::DebugComparison<char16_t&,char16_t_const&>&,unsigned_long&,kj::CappedArray<char,5ul>,kj::CappedArray<char,5ul>>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x36,ERROR,
                 "\"failed: expected \" \"result[i] == expected[i]\", _kjCondition, i, hex(result[i]), hex(expected[i])"
                 ,(char (*) [42])"failed: expected result[i] == expected[i]",
                 (DebugComparison<char16_t_&,_const_char16_t_&> *)&_kjCondition,&i,&local_40,
                 &local_50);
    }
    lVar4 = lVar4 + 2;
  }
  return;
}

Assistant:

void expectResImpl(EncodingResult<T> result,
                   ArrayPtr<const U> expected,
                   bool errors = false) {
  if (errors) {
    KJ_EXPECT(result.hadErrors);
  } else {
    KJ_EXPECT(!result.hadErrors);
  }

  KJ_EXPECT(result.size() == expected.size(), result.size(), expected.size());
  for (auto i: kj::zeroTo(kj::min(result.size(), expected.size()))) {
    KJ_EXPECT(result[i] == expected[i], i, hex(result[i]), hex(expected[i]));
  }
}